

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O0

double integrate(function<double_(double)> *func,double a,double b,double h,int threads_num)

{
  allocator<unsigned_long> *this;
  double dVar1;
  size_type __n;
  reference __dest;
  unsigned_long *puVar2;
  Argument *pAVar3;
  reference pvVar4;
  long lVar5;
  int local_f4;
  double *pdStack_f0;
  int i_1;
  double *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_bc;
  double dStack_b8;
  int i;
  double step;
  double result;
  pthread_mutex_t mutex;
  undefined1 local_78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  allocator<Argument> local_49;
  undefined1 local_48 [8];
  vector<Argument,_std::allocator<Argument>_> args;
  int threads_num_local;
  double h_local;
  double b_local;
  double a_local;
  function<double_(double)> *func_local;
  
  args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = threads_num;
  h_local = b;
  b_local = a;
  a_local = (double)func;
  std::allocator<Argument>::allocator(&local_49);
  std::vector<Argument,_std::allocator<Argument>_>::vector
            ((vector<Argument,_std::allocator<Argument>_> *)local_48,(long)threads_num,&local_49);
  std::allocator<Argument>::~allocator(&local_49);
  __n = (size_type)
        args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_;
  this = (allocator<unsigned_long> *)((long)&mutex.__data.__list.__next + 7);
  std::allocator<unsigned_long>::allocator(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,__n,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)((long)&mutex.__data.__list.__next + 7));
  memset(&result,0,0x28);
  if (h_local < b_local) {
    std::swap<double>(&b_local,&h_local);
  }
  step = 0.0;
  dStack_b8 = (h_local - b_local) /
              (double)args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
  for (local_bc = 0;
      local_bc <
      args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_bc = local_bc + 1) {
    pdStack_f0 = &result;
    local_e8 = &step;
    local_e0 = dStack_b8 * (double)local_bc + b_local;
    local_d8 = dStack_b8 * (double)(local_bc + 1) + b_local;
    local_c8 = a_local;
    local_d0 = h;
    __dest = std::vector<Argument,_std::allocator<Argument>_>::operator[]
                       ((vector<Argument,_std::allocator<Argument>_> *)local_48,(long)local_bc);
    memcpy(__dest,&stack0xffffffffffffff10,0x30);
    puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    lVar5 = (long)local_bc;
    pAVar3 = std::vector<Argument,_std::allocator<Argument>_>::data
                       ((vector<Argument,_std::allocator<Argument>_> *)local_48);
    pthread_create(puVar2 + lVar5,(pthread_attr_t *)0x0,integrate_thread,pAVar3 + local_bc);
  }
  for (local_f4 = 0; dVar1 = step,
      local_f4 <
      args.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_f4 = local_f4 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
                        (long)local_f4);
    pthread_join(*pvVar4,(void **)0x0);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  std::vector<Argument,_std::allocator<Argument>_>::~vector
            ((vector<Argument,_std::allocator<Argument>_> *)local_48);
  return dVar1;
}

Assistant:

double integrate(std::function<double(double)> const &func, double a, double b, double h, int threads_num){
  std::vector<Argument> args(static_cast<unsigned long>(threads_num));
  std::vector<pthread_t> threads(static_cast<unsigned long>(threads_num));
  pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  if (b < a){
    std::swap(a, b);
  }
  double result = 0;
  double step = (b - a) / threads_num;
  for(auto i = 0; i < threads_num; ++i){
    args[i] = {&mutex, &result, a + step * i, a + step * (i + 1), h, &func};
    pthread_create(threads.data() + i, nullptr, integrate_thread, args.data() + i);
  }
  for(auto i = 0; i < threads_num; ++i) {
    pthread_join(threads[i], nullptr);
  }
  return result;
}